

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O2

cmCommand * __thiscall cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *pcVar2;
  
  pcVar2 = (cmCommand *)operator_new(0x40);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0072c148;
  pcVar1 = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  pcVar2[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  pcVar2[1].Makefile = pcVar1;
  return pcVar2;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestRunScriptCommand* ni = new cmCTestRunScriptCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }